

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O2

bool CoreML::Specification::operator==
               (KNearestNeighborsClassifier *a,KNearestNeighborsClassifier *b)

{
  int iVar1;
  uint32 uVar2;
  long lVar3;
  bool bVar4;
  Type *pTVar5;
  Type *pTVar6;
  Int64Parameter *pIVar7;
  Int64Range *pIVar8;
  Int64Vector *a_00;
  Int64Vector *b_00;
  Int64Set *pIVar9;
  int64 iVar10;
  int64 iVar11;
  StringVector *a_01;
  StringVector *b_01;
  int i;
  uint uVar12;
  NearestNeighborsIndex *pNVar13;
  Int64Parameter *pIVar14;
  ulong uVar15;
  ulong uVar16;
  NearestNeighborsIndex aIndex;
  NearestNeighborsIndex bIndex;
  NearestNeighborsIndex local_d0;
  NearestNeighborsIndex local_80;
  
  pNVar13 = a->nearestneighborsindex_;
  if (pNVar13 == (NearestNeighborsIndex *)0x0) {
    pNVar13 = (NearestNeighborsIndex *)&_NearestNeighborsIndex_default_instance_;
  }
  NearestNeighborsIndex::NearestNeighborsIndex(&local_d0,pNVar13);
  pNVar13 = b->nearestneighborsindex_;
  if (pNVar13 == (NearestNeighborsIndex *)0x0) {
    pNVar13 = (NearestNeighborsIndex *)&_NearestNeighborsIndex_default_instance_;
  }
  NearestNeighborsIndex::NearestNeighborsIndex(&local_80,pNVar13);
  if (local_d0.numberofdimensions_ == local_80.numberofdimensions_) {
    uVar12 = 0;
    if (local_d0.floatsamples_.super_RepeatedPtrFieldBase.current_size_ !=
        local_80.floatsamples_.super_RepeatedPtrFieldBase.current_size_) goto LAB_0026dd05;
    do {
      if (local_d0.floatsamples_.super_RepeatedPtrFieldBase.current_size_ <= (int)uVar12) {
        if ((local_d0._oneof_case_[0] == local_80._oneof_case_[0]) &&
           (local_d0._oneof_case_[1] == local_80._oneof_case_[1])) {
          pIVar14 = a->numberofneighbors_;
          if (pIVar14 == (Int64Parameter *)0x0) {
            pIVar14 = (Int64Parameter *)&_Int64Parameter_default_instance_;
          }
          pIVar7 = b->numberofneighbors_;
          if (pIVar7 == (Int64Parameter *)0x0) {
            pIVar7 = (Int64Parameter *)&_Int64Parameter_default_instance_;
          }
          if ((pIVar14->defaultvalue_ == pIVar7->defaultvalue_) &&
             (uVar2 = pIVar14->_oneof_case_[0], uVar2 == pIVar7->_oneof_case_[0])) {
            if (uVar2 == 0xb) {
              pIVar9 = Int64Parameter::set(pIVar14);
              pIVar14 = b->numberofneighbors_;
              if (pIVar14 == (Int64Parameter *)0x0) {
                pIVar14 = (Int64Parameter *)&_Int64Parameter_default_instance_;
              }
              iVar1 = (pIVar9->values_).current_size_;
              pIVar9 = Int64Parameter::set(pIVar14);
              if (iVar1 == (pIVar9->values_).current_size_) {
                pIVar14 = a->numberofneighbors_;
                if (pIVar14 == (Int64Parameter *)0x0) {
                  pIVar14 = (Int64Parameter *)&_Int64Parameter_default_instance_;
                }
                pIVar9 = Int64Parameter::set(pIVar14);
                uVar12 = (pIVar9->values_).current_size_;
                uVar16 = 0;
                uVar15 = (ulong)uVar12;
                if ((int)uVar12 < 1) {
                  uVar15 = uVar16;
                }
                uVar12 = 0;
                goto LAB_0026dcad;
              }
            }
            else {
              if (uVar2 != 10) goto LAB_0026dc1c;
              pIVar8 = Int64Parameter::range(pIVar14);
              pIVar14 = b->numberofneighbors_;
              if (pIVar14 == (Int64Parameter *)0x0) {
                pIVar14 = (Int64Parameter *)&_Int64Parameter_default_instance_;
              }
              lVar3 = pIVar8->minvalue_;
              pIVar8 = Int64Parameter::range(pIVar14);
              if (lVar3 == pIVar8->minvalue_) {
                pIVar14 = a->numberofneighbors_;
                if (pIVar14 == (Int64Parameter *)0x0) {
                  pIVar14 = (Int64Parameter *)&_Int64Parameter_default_instance_;
                }
                pIVar8 = Int64Parameter::range(pIVar14);
                pIVar14 = b->numberofneighbors_;
                if (pIVar14 == (Int64Parameter *)0x0) {
                  pIVar14 = (Int64Parameter *)&_Int64Parameter_default_instance_;
                }
                lVar3 = pIVar8->maxvalue_;
                pIVar8 = Int64Parameter::range(pIVar14);
                if (lVar3 == pIVar8->maxvalue_) goto LAB_0026dc1c;
              }
            }
          }
        }
        break;
      }
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
                         (&local_d0.floatsamples_.super_RepeatedPtrFieldBase,uVar12);
      iVar1 = (pTVar5->vector_).current_size_;
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
                         (&local_80.floatsamples_.super_RepeatedPtrFieldBase,uVar12);
      if (iVar1 != (pTVar5->vector_).current_size_) break;
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
                         (&local_d0.floatsamples_.super_RepeatedPtrFieldBase,uVar12);
      pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
                         (&local_80.floatsamples_.super_RepeatedPtrFieldBase,uVar12);
      bVar4 = operator!=(&pTVar5->vector_,&pTVar6->vector_);
      uVar12 = uVar12 + 1;
    } while (!bVar4);
  }
LAB_0026dd03:
  uVar12 = 0;
LAB_0026dd05:
  NearestNeighborsIndex::~NearestNeighborsIndex(&local_80);
  NearestNeighborsIndex::~NearestNeighborsIndex(&local_d0);
  return SUB41(uVar12,0);
  while( true ) {
    pIVar14 = a->numberofneighbors_;
    if (pIVar14 == (Int64Parameter *)0x0) {
      pIVar14 = (Int64Parameter *)&_Int64Parameter_default_instance_;
    }
    pIVar9 = Int64Parameter::set(pIVar14);
    iVar10 = Int64Set::values(pIVar9,(int)uVar16);
    pIVar14 = b->numberofneighbors_;
    if (pIVar14 == (Int64Parameter *)0x0) {
      pIVar14 = (Int64Parameter *)&_Int64Parameter_default_instance_;
    }
    pIVar9 = Int64Parameter::set(pIVar14);
    iVar11 = Int64Set::values(pIVar9,(int)uVar16);
    uVar16 = uVar16 + 1;
    if (iVar10 != iVar11) break;
LAB_0026dcad:
    if (uVar15 == uVar16) goto LAB_0026dc1c;
  }
  goto LAB_0026dd05;
LAB_0026dc1c:
  uVar2 = a->_oneof_case_[0];
  if (uVar2 == b->_oneof_case_[0]) {
    if (uVar2 == 0) {
      uVar12 = 1;
      goto LAB_0026dd05;
    }
    if (uVar2 == 100) {
      a_01 = KNearestNeighborsClassifier::stringclasslabels(a);
      b_01 = KNearestNeighborsClassifier::stringclasslabels(b);
      bVar4 = vectorsEqual<CoreML::Specification::StringVector>(a_01,b_01);
    }
    else {
      if (uVar2 != 0x65) goto LAB_0026dd03;
      a_00 = KNearestNeighborsClassifier::int64classlabels(a);
      b_00 = KNearestNeighborsClassifier::int64classlabels(b);
      bVar4 = vectorsEqual<CoreML::Specification::Int64Vector>(a_00,b_00);
    }
    uVar12 = (uint)bVar4;
    goto LAB_0026dd05;
  }
  goto LAB_0026dd03;
}

Assistant:

bool operator==(const KNearestNeighborsClassifier& a,
                        const KNearestNeighborsClassifier& b) {
            auto aIndex = a.nearestneighborsindex();
            auto bIndex = b.nearestneighborsindex();
            if (aIndex.numberofdimensions() != bIndex.numberofdimensions()) {
                return false;
            }
            if (aIndex.floatsamples_size() != bIndex.floatsamples_size()) {
                return false;
            }
            for (int i = 0; i < aIndex.floatsamples_size(); i++) {
                if (aIndex.floatsamples(i).vector_size() != bIndex.floatsamples(i).vector_size()) {
                    return false;
                }
                if (aIndex.floatsamples(i).vector() != bIndex.floatsamples(i).vector()) {
                    return false;
                }
            }
            if (aIndex.IndexType_case() != bIndex.IndexType_case()) {
                return false;
            }
            if (aIndex.DistanceFunction_case() != bIndex.DistanceFunction_case()) {
                return false;
            }
            if (a.numberofneighbors().defaultvalue() != b.numberofneighbors().defaultvalue()) {
                return false;
            }
            if (a.numberofneighbors().AllowedValues_case() != b.numberofneighbors().AllowedValues_case()) {
                return false;
            }
            switch (a.numberofneighbors().AllowedValues_case()) {
                case Specification::Int64Parameter::AllowedValuesCase::kRange:
                {
                    if (a.numberofneighbors().range().minvalue() != b.numberofneighbors().range().minvalue() || a.numberofneighbors().range().maxvalue() != b.numberofneighbors().range().maxvalue()) {
                        return false;
                    }
                    break;
                }
                case Specification::Int64Parameter::AllowedValuesCase::kSet:
                {
                    if (a.numberofneighbors().set().values_size() != b.numberofneighbors().set().values_size()) {
                        return false;
                    }
                    int64_t count = a.numberofneighbors().set().values_size();
                    for (int64_t i = 0; i < count; i++) {
                        if (a.numberofneighbors().set().values((int)i) != b.numberofneighbors().set().values((int)i)) {
                            return false;
                        }
                    } // for i in set
                    break;
                } // case kSet
                case Specification::Int64Parameter::AllowedValuesCase::ALLOWEDVALUES_NOT_SET:
                    break;
            } // switch AllowedValuesCase
            if (a.ClassLabels_case() != b.ClassLabels_case()) {
                return false;
            }
            switch (a.ClassLabels_case()) {
                case KNearestNeighborsClassifier::kInt64ClassLabels:
                    return a.int64classlabels() == b.int64classlabels();
                case KNearestNeighborsClassifier::kStringClassLabels:
                    return a.stringclasslabels() == b.stringclasslabels();
                case KNearestNeighborsClassifier::CLASSLABELS_NOT_SET:
                    return true;
            }
            if (a.WeightingScheme_case() != b.WeightingScheme_case()) {
                return false;
            }
        }